

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::getVerifierSuffix(QueryType type)

{
  char *pcStack_10;
  QueryType type_local;
  
  if (type == QUERY_PROGRAM_INTEGER || type == QUERY_PROGRAM_INTEGER_VEC3) {
    pcStack_10 = "get_programiv";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getVerifierSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_PROGRAM_INTEGER_VEC3:
		case QUERY_PROGRAM_INTEGER:
			return "get_programiv";

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}